

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O1

int solver2_lit_removable_rec(sat_solver2 *s,int v)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  int *piVar4;
  int iVar5;
  ulong uVar6;
  int newsize;
  uint *puVar7;
  
  bVar2 = *(byte *)(s->vi + v);
  if ((bVar2 >> 2 & 2) == 0) {
    uVar3 = s->reasons[v];
    if (uVar3 == 0) {
      puVar7 = (uint *)0x0;
    }
    else {
      uVar1 = (s->Mem).uPageMask & uVar3;
      if (uVar1 == 0) {
        __assert_fail("k",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satClause.h"
                      ,0x60,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
      }
      puVar7 = (uint *)((s->Mem).pPages[(int)uVar3 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                       (int)uVar1);
    }
    if (puVar7 == (uint *)0x0) {
joined_r0x004f5704:
      if ((bVar2 & 0x3c) == 0) {
        uVar3 = (s->tagged).cap;
        if ((s->tagged).size == uVar3) {
          iVar5 = (uVar3 >> 1) * 3;
          if ((int)uVar3 < 4) {
            iVar5 = uVar3 * 2;
          }
          piVar4 = (s->tagged).ptr;
          if (piVar4 == (int *)0x0) {
            piVar4 = (int *)malloc((long)iVar5 << 2);
          }
          else {
            piVar4 = (int *)realloc(piVar4,(long)iVar5 << 2);
          }
          (s->tagged).ptr = piVar4;
          if (piVar4 == (int *)0x0) {
            printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                   (double)(s->tagged).cap * 9.5367431640625e-07,(double)iVar5 * 9.5367431640625e-07
                  );
            fflush(_stdout);
          }
          (s->tagged).cap = iVar5;
        }
        iVar5 = (s->tagged).size;
        (s->tagged).size = iVar5 + 1;
        (s->tagged).ptr[iVar5] = v;
      }
      *(byte *)(s->vi + v) = *(byte *)(s->vi + v) | 8;
      uVar3 = 0;
    }
    else {
      if (0xfff < *puVar7) {
        uVar6 = 1;
        do {
          if (puVar7[uVar6 + 1] < 2) break;
          iVar5 = (int)puVar7[uVar6 + 1] >> 1;
          if ((*(byte *)(s->vi + iVar5) & 4) == 0) {
            bVar2 = *(byte *)(s->vi + iVar5) >> 2 & 0xf;
            if (((bVar2 != 6) && (s->levels[iVar5] != 0)) &&
               ((bVar2 == 2 ||
                ((-1 < (s->trail_lim).ptr[s->levels[iVar5]] ||
                 (iVar5 = solver2_lit_removable_rec(s,iVar5), iVar5 == 0)))))) {
              bVar2 = *(byte *)(s->vi + v);
              goto joined_r0x004f5704;
            }
          }
          else {
            solver2_lit_removable_rec(s,iVar5);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < *puVar7 >> 0xb);
      }
      if ((s->fProofLogging != 0) && (((uint)s->vi[v] & 4) != 0)) {
        uVar3 = (s->min_lit_order).cap;
        if ((s->min_lit_order).size == uVar3) {
          iVar5 = (uVar3 >> 1) * 3;
          if ((int)uVar3 < 4) {
            iVar5 = uVar3 * 2;
          }
          piVar4 = (s->min_lit_order).ptr;
          if (piVar4 == (int *)0x0) {
            piVar4 = (int *)malloc((long)iVar5 << 2);
          }
          else {
            piVar4 = (int *)realloc(piVar4,(long)iVar5 << 2);
          }
          (s->min_lit_order).ptr = piVar4;
          if (piVar4 == (int *)0x0) {
            printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                   (double)(s->min_lit_order).cap * 9.5367431640625e-07,
                   (double)iVar5 * 9.5367431640625e-07);
            fflush(_stdout);
          }
          (s->min_lit_order).cap = iVar5;
        }
        iVar5 = (s->min_lit_order).size;
        (s->min_lit_order).size = iVar5 + 1;
        (s->min_lit_order).ptr[iVar5] = v;
      }
      if (((uint)s->vi[v] & 0x3c) == 0) {
        uVar3 = (s->tagged).cap;
        if ((s->tagged).size == uVar3) {
          iVar5 = (uVar3 >> 1) * 3;
          if ((int)uVar3 < 4) {
            iVar5 = uVar3 * 2;
          }
          piVar4 = (s->tagged).ptr;
          if (piVar4 == (int *)0x0) {
            piVar4 = (int *)malloc((long)iVar5 << 2);
          }
          else {
            piVar4 = (int *)realloc(piVar4,(long)iVar5 << 2);
          }
          (s->tagged).ptr = piVar4;
          if (piVar4 == (int *)0x0) {
            printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                   (double)(s->tagged).cap * 9.5367431640625e-07,(double)iVar5 * 9.5367431640625e-07
                  );
            fflush(_stdout);
          }
          (s->tagged).cap = iVar5;
        }
        iVar5 = (s->tagged).size;
        (s->tagged).size = iVar5 + 1;
        (s->tagged).ptr[iVar5] = v;
      }
      *(byte *)(s->vi + v) = *(byte *)(s->vi + v) | 0x18;
      uVar3 = 1;
    }
  }
  else {
    uVar3 = bVar2 >> 4 & 1;
  }
  return uVar3;
}

Assistant:

static int solver2_lit_removable_rec(sat_solver2* s, int v)
{
    // tag[0]: True if original conflict clause literal.
    // tag[1]: Processed by this procedure
    // tag[2]: 0=non-removable, 1=removable

    clause* c;
    int i, x;

    // skip visited
    if (var_tag(s,v) & 2)
        return (var_tag(s,v) & 4) > 0;

    // skip decisions on a wrong level
    c = clause2_read(s, var_reason(s,v));
    if ( c == NULL ){
        var_add_tag(s,v,2);
        return 0;
    }

    clause_foreach_var( c, x, i, 1 ){
        if (var_tag(s,x) & 1)
            solver2_lit_removable_rec(s, x);
        else{
            if (var_level(s,x) == 0 || var_tag(s,x) == 6) continue;     // -- 'x' checked before, found to be removable (or belongs to the toplevel)
            if (var_tag(s,x) == 2 || !var_lev_mark(s,x) || !solver2_lit_removable_rec(s, x))
            {  // -- 'x' checked before, found NOT to be removable, or it belongs to a wrong level, or cannot be removed
                var_add_tag(s,v,2);
                return 0;
            }
        }
    }
    if ( s->fProofLogging && (var_tag(s,v) & 1) )
        veci_push(&s->min_lit_order, v );
    var_add_tag(s,v,6);
    return 1;
}